

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O3

bool deqp::gles31::Functional::anon_unknown_2::verifyGreenImage(Surface *image,TestLog *log)

{
  ostringstream *poVar1;
  uint uVar2;
  uint uVar3;
  ConstPixelBufferAccess *pCVar4;
  void *__buf;
  void *__buf_00;
  int iVar5;
  int iVar6;
  bool bVar7;
  ulong uVar8;
  void *pvVar9;
  int iVar10;
  TextureFormat local_2a8;
  string local_2a0;
  string local_280;
  ConstPixelBufferAccess local_260;
  LogImage local_238;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying result image, expecting green.",0x28);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_130);
  if (0 < image->m_height) {
    uVar2 = image->m_width;
    iVar5 = 0;
    bVar7 = false;
    iVar6 = 0;
    do {
      uVar8 = (ulong)uVar2;
      iVar10 = iVar5;
      if (0 < (int)uVar2) {
        do {
          uVar3 = *(uint *)((long)(image->m_pixels).m_ptr + (long)iVar10 * 4);
          bVar7 = (bool)((uVar3 & 0xff00ff) != 0 | bVar7 | (uVar3 & 0xff00) < 0xf700);
          iVar10 = iVar10 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      iVar6 = iVar6 + 1;
      iVar5 = iVar5 + uVar2;
    } while (iVar6 != image->m_height);
    if (bVar7) {
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ResultImage","");
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Result Image","");
      local_2a8.order = RGBA;
      local_2a8.type = UNORM_INT8;
      pvVar9 = (void *)(image->m_pixels).m_cap;
      if (pvVar9 != (void *)0x0) {
        pvVar9 = (image->m_pixels).m_ptr;
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&local_260,&local_2a8,image->m_width,image->m_height,1,pvVar9);
      pCVar4 = &local_260;
      tcu::LogImage::LogImage
                (&local_238,&local_280,&local_2a0,pCVar4,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_238,(int)log,__buf,(size_t)pCVar4);
      poVar1 = (ostringstream *)(local_1a8 + 8);
      local_1a8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Image verification failed.",0x1a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.m_description._M_dataplus._M_p != &local_238.m_description.field_2) {
        operator_delete(local_238.m_description._M_dataplus._M_p,
                        local_238.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.m_name._M_dataplus._M_p != &local_238.m_name.field_2) {
        operator_delete(local_238.m_name._M_dataplus._M_p,
                        local_238.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      return false;
    }
  }
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ResultImage","");
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Result Image","");
  local_2a8.order = RGBA;
  local_2a8.type = UNORM_INT8;
  pvVar9 = (void *)(image->m_pixels).m_cap;
  if (pvVar9 != (void *)0x0) {
    pvVar9 = (image->m_pixels).m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_260,&local_2a8,image->m_width,image->m_height,1,pvVar9);
  pCVar4 = &local_260;
  tcu::LogImage::LogImage(&local_238,&local_280,&local_2a0,pCVar4,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_238,(int)log,__buf_00,(size_t)pCVar4);
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Image verification passed.",0x1a);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_description._M_dataplus._M_p != &local_238.m_description.field_2) {
    operator_delete(local_238.m_description._M_dataplus._M_p,
                    local_238.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_name._M_dataplus._M_p != &local_238.m_name.field_2) {
    operator_delete(local_238.m_name._M_dataplus._M_p,
                    local_238.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

static bool verifyGreenImage (const tcu::Surface& image, tcu::TestLog& log)
{
	bool error = false;

	log << tcu::TestLog::Message << "Verifying result image, expecting green." << tcu::TestLog::EndMessage;

	// all pixels must be green

	for (int y = 0; y < image.getHeight(); ++y)
	for (int x = 0; x < image.getWidth(); ++x)
	{
		const tcu::RGBA color			= image.getPixel(x, y);
		const int		greenThreshold	= 8;

		if (color.getRed() > 0 || color.getGreen() < 255-greenThreshold || color.getBlue() > 0)
			error = true;
	}

	if (error)
		log	<< tcu::TestLog::Image("ResultImage", "Result Image", image.getAccess())
			<< tcu::TestLog::Message
			<< "Image verification failed."
			<< tcu::TestLog::EndMessage;
	else
		log	<< tcu::TestLog::Image("ResultImage", "Result Image", image.getAccess())
			<< tcu::TestLog::Message
			<< "Image verification passed."
			<< tcu::TestLog::EndMessage;

	return !error;
}